

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,bool deterministic,uint8 *target)

{
  int iVar1;
  int size;
  uint uVar2;
  char *pcVar3;
  string *psVar4;
  FileDescriptorProto *value;
  UnknownFieldSet *unknown_fields;
  uint local_50;
  uint n_1;
  uint i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  CodeGeneratorRequest *this_local;
  
  i_1 = 0;
  iVar1 = file_to_generate_size(this);
  _i = target;
  for (; (int)i_1 < iVar1; i_1 = i_1 + 1) {
    file_to_generate_abi_cxx11_(this,i_1);
    pcVar3 = (char *)std::__cxx11::string::data();
    file_to_generate_abi_cxx11_(this,i_1);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar3,size,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    psVar4 = file_to_generate_abi_cxx11_(this,i_1);
    _i = internal::WireFormatLite::WriteStringToArray(1,psVar4,_i);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    parameter_abi_cxx11_(this);
    pcVar3 = (char *)std::__cxx11::string::data();
    parameter_abi_cxx11_(this);
    iVar1 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar3,iVar1,SERIALIZE,"google.protobuf.compiler.CodeGeneratorRequest.parameter");
    psVar4 = parameter_abi_cxx11_(this);
    _i = internal::WireFormatLite::WriteStringToArray(2,psVar4,_i);
  }
  if ((uVar2 & 2) != 0) {
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::compiler::Version>
                   (3,this->compiler_version_,deterministic,_i);
  }
  local_50 = 0;
  uVar2 = proto_file_size(this);
  for (; local_50 < uVar2; local_50 = local_50 + 1) {
    value = proto_file(this,local_50);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::FileDescriptorProto>
                   (0xf,value,deterministic,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = CodeGeneratorRequest::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->file_to_generate_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1, this->file_to_generate(i), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->parameter(), target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->compiler_version_, deterministic, target);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0, n = this->proto_file_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        15, this->proto_file(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}